

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schematron.c
# Opt level: O0

xmlSchematronRulePtr_conflict
xmlSchematronAddRule
          (xmlSchematronParserCtxtPtr ctxt,xmlSchematronPtr schema,
          xmlSchematronPatternPtr_conflict pat,xmlNodePtr node,xmlChar *context,xmlChar *report)

{
  xmlPatternPtr pxVar1;
  xmlSchematronRulePtr_conflict local_60;
  xmlSchematronRulePtr_conflict prev_1;
  xmlSchematronRulePtr_conflict prev;
  xmlPatternPtr pattern;
  xmlSchematronRulePtr_conflict ret;
  xmlChar *report_local;
  xmlChar *context_local;
  xmlNodePtr node_local;
  xmlSchematronPatternPtr_conflict pat_local;
  xmlSchematronPtr schema_local;
  xmlSchematronParserCtxtPtr ctxt_local;
  
  if ((((ctxt == (xmlSchematronParserCtxtPtr)0x0) || (schema == (xmlSchematronPtr)0x0)) ||
      (node == (xmlNodePtr)0x0)) || (context == (xmlChar *)0x0)) {
    ctxt_local = (xmlSchematronParserCtxtPtr)0x0;
  }
  else {
    pxVar1 = xmlPatterncompile(context,ctxt->dict,1,ctxt->namespaces);
    if (pxVar1 == (xmlPatternPtr)0x0) {
      xmlSchematronPErr(ctxt,node,0x6df,"Failed to compile context expression %s",context,
                        (xmlChar *)0x0);
    }
    ctxt_local = (xmlSchematronParserCtxtPtr)(*xmlMalloc)(0x38);
    if (ctxt_local == (xmlSchematronParserCtxtPtr)0x0) {
      xmlSchematronPErrMemory(ctxt,"allocating schema rule",node);
      ctxt_local = (xmlSchematronParserCtxtPtr)0x0;
    }
    else {
      memset(ctxt_local,0,0x38);
      ctxt_local->doc = (xmlDocPtr)node;
      *(xmlChar **)&ctxt_local->preserve = context;
      *(xmlPatternPtr *)&ctxt_local->size = pxVar1;
      ctxt_local->dict = (xmlDictPtr)report;
      *(undefined8 *)ctxt_local = 0;
      if (schema->rules == (xmlSchematronRulePtr_conflict)0x0) {
        schema->rules = (xmlSchematronRulePtr_conflict)ctxt_local;
      }
      else {
        for (prev_1 = schema->rules; prev_1->next != (xmlSchematronRulePtr)0x0;
            prev_1 = prev_1->next) {
        }
        prev_1->next = (xmlSchematronRulePtr)ctxt_local;
      }
      ctxt_local->URL = (xmlChar *)0x0;
      if (pat->rules == (xmlSchematronRulePtr_conflict)0x0) {
        pat->rules = (xmlSchematronRulePtr_conflict)ctxt_local;
      }
      else {
        for (local_60 = pat->rules; local_60->patnext != (xmlSchematronRulePtr)0x0;
            local_60 = local_60->patnext) {
        }
        local_60->patnext = (xmlSchematronRulePtr)ctxt_local;
      }
    }
  }
  return (xmlSchematronRulePtr_conflict)ctxt_local;
}

Assistant:

static xmlSchematronRulePtr
xmlSchematronAddRule(xmlSchematronParserCtxtPtr ctxt, xmlSchematronPtr schema,
                     xmlSchematronPatternPtr pat, xmlNodePtr node,
		     xmlChar *context, xmlChar *report)
{
    xmlSchematronRulePtr ret;
    xmlPatternPtr pattern;

    if ((ctxt == NULL) || (schema == NULL) || (node == NULL) ||
        (context == NULL))
        return(NULL);

    /*
     * Try first to compile the pattern
     */
    pattern = xmlPatterncompile(context, ctxt->dict, XML_PATTERN_XPATH,
                                ctxt->namespaces);
    if (pattern == NULL) {
	xmlSchematronPErr(ctxt, node,
	    XML_SCHEMAP_NOROOT,
	    "Failed to compile context expression %s",
	    context, NULL);
    }

    ret = (xmlSchematronRulePtr) xmlMalloc(sizeof(xmlSchematronRule));
    if (ret == NULL) {
        xmlSchematronPErrMemory(ctxt, "allocating schema rule", node);
        return (NULL);
    }
    memset(ret, 0, sizeof(xmlSchematronRule));
    ret->node = node;
    ret->context = context;
    ret->pattern = pattern;
    ret->report = report;
    ret->next = NULL;
    if (schema->rules == NULL) {
	schema->rules = ret;
    } else {
        xmlSchematronRulePtr prev = schema->rules;

	while (prev->next != NULL)
	     prev = prev->next;
        prev->next = ret;
    }
    ret->patnext = NULL;
    if (pat->rules == NULL) {
	pat->rules = ret;
    } else {
        xmlSchematronRulePtr prev = pat->rules;

	while (prev->patnext != NULL)
	     prev = prev->patnext;
        prev->patnext = ret;
    }
    return (ret);
}